

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afangles.c
# Opt level: O1

void af_sort_and_quantize_widths(FT_UInt *count,AF_Width table,FT_Pos threshold)

{
  AF_Width pAVar1;
  FT_Pos FVar2;
  FT_Pos FVar3;
  FT_Pos FVar4;
  uint uVar5;
  AF_Width pAVar6;
  uint uVar7;
  long lVar9;
  long lVar10;
  ulong uVar11;
  uint uVar12;
  FT_Pos FVar13;
  uint uVar14;
  AF_WidthRec swap;
  ulong uVar8;
  
  if (*count != 1) {
    uVar7 = *count;
    if (1 < uVar7) {
      uVar5 = 1;
      do {
        uVar11 = (ulong)uVar5;
        do {
          uVar7 = (int)uVar11 - 1;
          uVar8 = (ulong)uVar7;
          if (table[uVar8].org <= table[uVar11].org) break;
          pAVar6 = table + uVar11;
          pAVar1 = table + uVar8;
          FVar13 = pAVar6->fit;
          FVar2 = pAVar6->org;
          FVar3 = pAVar6->cur;
          pAVar6->fit = pAVar1->fit;
          FVar4 = pAVar1->cur;
          pAVar6->org = pAVar1->org;
          pAVar6->cur = FVar4;
          pAVar1->fit = FVar13;
          pAVar1->org = FVar2;
          pAVar1->cur = FVar3;
          uVar11 = uVar8;
        } while (uVar7 != 0);
        uVar5 = uVar5 + 1;
        uVar7 = *count;
      } while (uVar5 < uVar7);
    }
    if (1 < uVar7) {
      FVar13 = table->org;
      uVar5 = uVar7 - 1;
      uVar12 = 1;
      uVar11 = 0;
      do {
        lVar9 = table[uVar12].org - FVar13;
        if ((uVar12 == uVar5) || (threshold < lVar9)) {
          uVar12 = (lVar9 <= threshold && uVar12 == uVar5) + uVar12;
          uVar14 = (uint)uVar11;
          if (uVar14 < uVar12) {
            pAVar6 = table + uVar11;
            lVar10 = 0;
            lVar9 = 0;
            do {
              lVar9 = lVar9 + pAVar6->org;
              pAVar6->org = 0;
              pAVar6 = pAVar6 + 1;
              lVar10 = lVar10 + -1;
            } while (uVar11 - uVar12 != lVar10);
            uVar14 = uVar14 - (int)lVar10;
          }
          else {
            lVar9 = 0;
          }
          table[uVar11].org = lVar9 / (long)(ulong)uVar14;
          if (uVar12 < uVar5) {
            uVar11 = (ulong)(uVar12 + 1);
            FVar13 = table[uVar11].org;
          }
        }
        uVar12 = uVar12 + 1;
      } while (uVar12 < uVar7);
    }
    uVar7 = 1;
    if (1 < *count) {
      pAVar6 = table + 1;
      uVar11 = 1;
      do {
        if (pAVar6->org != 0) {
          table[uVar7].fit = pAVar6->fit;
          FVar13 = pAVar6->cur;
          table[uVar7].org = pAVar6->org;
          table[uVar7].cur = FVar13;
          uVar7 = uVar7 + 1;
        }
        uVar11 = uVar11 + 1;
        pAVar6 = pAVar6 + 1;
      } while (uVar11 < *count);
    }
    *count = uVar7;
  }
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  af_sort_and_quantize_widths( FT_UInt*  count,
                               AF_Width  table,
                               FT_Pos    threshold )
  {
    FT_UInt      i, j;
    FT_UInt      cur_idx;
    FT_Pos       cur_val;
    FT_Pos       sum;
    AF_WidthRec  swap;


    if ( *count == 1 )
      return;

    /* sort */
    for ( i = 1; i < *count; i++ )
    {
      for ( j = i; j > 0; j-- )
      {
        if ( table[j].org >= table[j - 1].org )
          break;

        swap         = table[j];
        table[j]     = table[j - 1];
        table[j - 1] = swap;
      }
    }

    cur_idx = 0;
    cur_val = table[cur_idx].org;

    /* compute and use mean values for clusters not larger than  */
    /* `threshold'; this is very primitive and might not yield   */
    /* the best result, but normally, using reference character  */
    /* `o', `*count' is 2, so the code below is fully sufficient */
    for ( i = 1; i < *count; i++ )
    {
      if ( table[i].org - cur_val > threshold ||
           i == *count - 1                    )
      {
        sum = 0;

        /* fix loop for end of array */
        if ( table[i].org - cur_val <= threshold &&
             i == *count - 1                     )
          i++;

        for ( j = cur_idx; j < i; j++ )
        {
          sum         += table[j].org;
          table[j].org = 0;
        }
        table[cur_idx].org = sum / (FT_Pos)j;

        if ( i < *count - 1 )
        {
          cur_idx = i + 1;
          cur_val = table[cur_idx].org;
        }
      }
    }

    cur_idx = 1;

    /* compress array to remove zero values */
    for ( i = 1; i < *count; i++ )
    {
      if ( table[i].org )
        table[cur_idx++] = table[i];
    }

    *count = cur_idx;
  }